

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

int stbi__do_zlib(stbi__zbuf *a,char *obuf,int olen,int exp,int parse_header)

{
  stbi__zhuffman *z;
  stbi_uc *psVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  byte bVar6;
  ushort uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  byte *pbVar12;
  long lVar13;
  stbi_uc *psVar14;
  stbi_uc sVar15;
  ulong uVar16;
  long lVar17;
  stbi__uint32 sVar18;
  stbi__uint32 sVar19;
  uint uVar20;
  char *pcVar21;
  int iVar22;
  ulong uVar23;
  stbi_uc lencodes [455];
  stbi__zhuffman z_codelength;
  undefined8 local_a08;
  undefined7 uStack_a00;
  undefined4 uStack_9f9;
  byte bStack_9e9;
  stbi_uc local_9e8 [468];
  stbi__zhuffman local_814;
  
  a->zout_start = obuf;
  a->zout = obuf;
  a->zout_end = obuf + olen;
  a->z_expandable = exp;
  if (parse_header != 0) {
    pbVar12 = a->zbuffer;
    uVar8 = 0;
    if (pbVar12 < a->zbuffer_end) {
      a->zbuffer = pbVar12 + 1;
      uVar2 = (uint)*pbVar12;
      pbVar12 = pbVar12 + 1;
    }
    else {
      uVar2 = 0;
    }
    if (pbVar12 < a->zbuffer_end) {
      a->zbuffer = pbVar12 + 1;
      uVar8 = (uint)*pbVar12;
    }
    if ((((uVar8 & 0x20) != 0) ||
        (uVar8 = uVar8 | uVar2 << 8, uVar10 = uVar8 * 0x843 >> 0x10,
        uVar10 = ((uVar8 - uVar10 & 0xffff) >> 1) + uVar10 >> 4,
        (short)(((short)uVar10 - (short)(uVar10 << 5)) + (short)uVar8) != 0)) ||
       ((uVar2 & 0xf) != 8)) {
LAB_00116ee7:
      stbi__g_failure_reason = "Corrupt PNG";
switchD_00116706_caseD_3:
      return 0;
    }
  }
  a->num_bits = 0;
  a->code_buffer = 0;
  z = &a->z_distance;
  iVar11 = 0;
  do {
    if (iVar11 < 1) {
      stbi__fill_bits(a);
      iVar11 = a->num_bits;
    }
    uVar8 = a->code_buffer;
    sVar18 = uVar8 >> 1;
    a->code_buffer = sVar18;
    iVar3 = iVar11 + -1;
    a->num_bits = iVar3;
    if (iVar11 < 3) {
      stbi__fill_bits(a);
      iVar3 = a->num_bits;
      sVar18 = a->code_buffer;
    }
    sVar19 = sVar18 >> 2;
    a->code_buffer = sVar19;
    uVar2 = iVar3 - 2;
    a->num_bits = uVar2;
    switch(sVar18 & 3) {
    case 0:
      uVar10 = uVar2 & 7;
      if (uVar10 != 0) {
        if (iVar3 < 2) {
          stbi__fill_bits(a);
          uVar2 = a->num_bits;
          sVar19 = a->code_buffer;
        }
        sVar19 = sVar19 >> (sbyte)uVar10;
        a->code_buffer = sVar19;
        uVar2 = uVar2 - uVar10;
        a->num_bits = uVar2;
      }
      if ((int)uVar2 < 1) {
        if (uVar2 != 0) goto LAB_00116f2f;
        uVar23 = 0;
LAB_00116e45:
        psVar14 = a->zbuffer;
        psVar1 = a->zbuffer_end;
        do {
          if (psVar14 < psVar1) {
            a->zbuffer = psVar14 + 1;
            sVar15 = *psVar14;
            psVar14 = psVar14 + 1;
          }
          else {
            sVar15 = '\0';
          }
          *(stbi_uc *)((long)local_814.fast + uVar23) = sVar15;
          uVar23 = uVar23 + 1;
        } while (uVar23 != 4);
      }
      else {
        uVar10 = uVar2 - 1 >> 3;
        uVar23 = (ulong)(uVar10 + 1);
        uVar16 = 0xffffffffffffffff;
        do {
          *(char *)((long)local_814.fast + uVar16 + 1) = (char)sVar19;
          sVar19 = sVar19 >> 8;
          uVar16 = uVar16 + 1;
        } while (uVar10 != uVar16);
        a->code_buffer = sVar19;
        iVar11 = (uVar2 - 8) - (uVar2 - 1 & 0xfffffff8);
        a->num_bits = iVar11;
        if (iVar11 != 0) {
LAB_00116f2f:
          __assert_fail("a->num_bits == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/aaamp[P]entropy-experiment/thirdparty/SFML/extlibs/headers/stb_image/stb_image.h"
                        ,0xfc1,"int stbi__parse_uncompressed_block(stbi__zbuf *)");
        }
        if (uVar16 < 3) goto LAB_00116e45;
      }
      if ((local_814.fast[1] ^ local_814.fast[0]) == 0xffff) {
        psVar14 = a->zbuffer;
        uVar23 = (ulong)local_814.fast[0];
        if (psVar14 + uVar23 <= a->zbuffer_end) {
          pcVar21 = a->zout;
          if (a->zout_end < pcVar21 + uVar23) {
            iVar11 = stbi__zexpand(a,pcVar21,(uint)local_814.fast[0]);
            if (iVar11 == 0) {
              return 0;
            }
            psVar14 = a->zbuffer;
            pcVar21 = a->zout;
          }
          memcpy(pcVar21,psVar14,uVar23);
          a->zbuffer = a->zbuffer + uVar23;
          a->zout = a->zout + uVar23;
          goto LAB_00116ed8;
        }
      }
      goto LAB_00116ee7;
    case 1:
      iVar11 = stbi__zbuild_huffman
                         (&a->z_length,
                          "\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\b\b\b\b\b\b\b\b"
                          ,0x120);
      if (iVar11 == 0) {
        return 0;
      }
      iVar11 = stbi__zbuild_huffman
                         (z,
                          "\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05"
                          ,0x20);
      break;
    case 2:
      if (iVar3 < 7) {
        stbi__fill_bits(a);
        uVar2 = a->num_bits;
        sVar19 = a->code_buffer;
      }
      uVar10 = sVar19 >> 5;
      a->code_buffer = uVar10;
      iVar11 = uVar2 - 5;
      a->num_bits = iVar11;
      if ((int)uVar2 < 10) {
        stbi__fill_bits(a);
        iVar11 = a->num_bits;
        uVar10 = a->code_buffer;
      }
      uVar2 = uVar10 >> 5;
      a->code_buffer = uVar2;
      iVar3 = iVar11 + -5;
      a->num_bits = iVar3;
      if (iVar11 < 9) {
        stbi__fill_bits(a);
        iVar3 = a->num_bits;
        uVar2 = a->code_buffer;
      }
      uVar20 = (sVar19 & 0x1f) + 0x101;
      iVar11 = (uVar10 & 0x1f) + 1;
      uVar10 = uVar2 >> 4;
      a->code_buffer = uVar10;
      iVar3 = iVar3 + -4;
      a->num_bits = iVar3;
      local_a08 = 0;
      uStack_a00 = 0;
      uStack_9f9 = 0;
      uVar23 = 0;
      do {
        uVar9 = uVar10;
        if (iVar3 < 3) {
          stbi__fill_bits(a);
          iVar3 = a->num_bits;
          uVar9 = a->code_buffer;
        }
        uVar10 = uVar9 >> 3;
        a->code_buffer = uVar10;
        iVar3 = iVar3 + -3;
        a->num_bits = iVar3;
        *(byte *)((long)&local_a08 +
                 (ulong)(byte)(&stbi__compute_huffman_codes(stbi__zbuf*)::length_dezigzag)[uVar23])
             = (byte)uVar9 & 7;
        uVar23 = uVar23 + 1;
      } while ((uVar2 & 0xf) + 4 != uVar23);
      iVar3 = stbi__zbuild_huffman(&local_814,(stbi_uc *)&local_a08,0x13);
      if (iVar3 == 0) {
        return 0;
      }
      iVar4 = iVar11 + uVar20;
      iVar3 = a->num_bits;
      iVar22 = 0;
      do {
        if (iVar3 < 0x10) {
          stbi__fill_bits(a);
        }
        uVar2 = a->code_buffer;
        uVar7 = local_814.fast[uVar2 & 0x1ff];
        if (uVar7 == 0) {
          uVar7 = (ushort)uVar2 << 8 | (ushort)uVar2 >> 8;
          uVar10 = (uVar7 & 0xf0f) << 4 | (uVar7 & 0xf0f0) >> 4;
          uVar10 = (uVar10 >> 2 & 0x3333) + (uVar10 & 0x3333) * 4;
          uVar10 = (uVar10 >> 1 & 0x5555) + (uVar10 & 0x5555) * 2;
          lVar5 = 0;
          do {
            lVar13 = lVar5;
            lVar5 = lVar13 + 1;
          } while (local_814.maxcode[lVar13 + 10] <= (int)uVar10);
          if (lVar5 == 7) goto LAB_00116ee7;
          lVar17 = (ulong)local_814.firstsymbol[lVar13 + 10] +
                   ((ulong)(uVar10 >> (7U - (char)lVar5 & 0x1f)) -
                   (ulong)local_814.firstcode[lVar13 + 10]);
          if ((ulong)*(byte *)((long)&local_814 + lVar17 + 0x484) - 9 != lVar5) goto LAB_00116f10;
          uVar2 = uVar2 >> ((char)lVar13 + 10U & 0x1f);
          a->code_buffer = uVar2;
          iVar3 = (a->num_bits - (int)lVar5) + -9;
          a->num_bits = iVar3;
          uVar7 = *(ushort *)((long)&local_814 + lVar17 * 2 + 0x5a4);
        }
        else {
          uVar2 = uVar2 >> ((byte)(uVar7 >> 9) & 0x1f);
          a->code_buffer = uVar2;
          iVar3 = a->num_bits - (uint)(uVar7 >> 9);
          a->num_bits = iVar3;
          uVar7 = uVar7 & 0x1ff;
        }
        if (0x12 < uVar7) goto LAB_00116ee7;
        if (uVar7 < 0x10) {
          lVar5 = (long)iVar22;
          iVar22 = iVar22 + 1;
          local_9e8[lVar5] = (char)uVar7;
        }
        else {
          if (uVar7 == 0x11) {
            if (iVar3 < 3) {
              stbi__fill_bits(a);
              iVar3 = a->num_bits;
              uVar2 = a->code_buffer;
            }
            a->code_buffer = uVar2 >> 3;
            iVar3 = iVar3 + -3;
            a->num_bits = iVar3;
            uVar2 = (uVar2 & 7) + 3;
LAB_00116a6e:
            bVar6 = 0;
          }
          else {
            if (uVar7 != 0x10) {
              if (iVar3 < 7) {
                stbi__fill_bits(a);
                iVar3 = a->num_bits;
                uVar2 = a->code_buffer;
              }
              a->code_buffer = uVar2 >> 7;
              iVar3 = iVar3 + -7;
              a->num_bits = iVar3;
              uVar2 = (uVar2 & 0x7f) + 0xb;
              goto LAB_00116a6e;
            }
            if (iVar3 < 2) {
              stbi__fill_bits(a);
              iVar3 = a->num_bits;
              uVar2 = a->code_buffer;
            }
            a->code_buffer = uVar2 >> 2;
            iVar3 = iVar3 + -2;
            a->num_bits = iVar3;
            if (iVar22 == 0) goto LAB_00116ee7;
            uVar2 = (uVar2 & 3) + 3;
            bVar6 = (&bStack_9e9)[iVar22];
          }
          if (iVar4 - iVar22 < (int)uVar2) goto LAB_00116ee7;
          memset(local_9e8 + iVar22,(uint)bVar6,(ulong)uVar2);
          iVar22 = iVar22 + uVar2;
        }
      } while (iVar22 < iVar4);
      if (iVar22 != iVar4) goto LAB_00116ee7;
      iVar3 = stbi__zbuild_huffman(&a->z_length,local_9e8,uVar20);
      if (iVar3 == 0) {
        return 0;
      }
      iVar11 = stbi__zbuild_huffman(z,local_9e8 + uVar20,iVar11);
      break;
    case 3:
      goto switchD_00116706_caseD_3;
    }
    if (iVar11 == 0) {
      return 0;
    }
    pcVar21 = a->zout;
    while( true ) {
      while( true ) {
        if (a->num_bits < 0x10) {
          stbi__fill_bits(a);
        }
        uVar2 = a->code_buffer;
        uVar7 = (a->z_length).fast[uVar2 & 0x1ff];
        if (uVar7 == 0) {
          uVar7 = (ushort)uVar2 << 8 | (ushort)uVar2 >> 8;
          uVar10 = (uVar7 & 0xf0f) << 4 | (uVar7 & 0xf0f0) >> 4;
          uVar10 = (uVar10 >> 2 & 0x3333) + (uVar10 & 0x3333) * 4;
          uVar10 = (uVar10 >> 1 & 0x5555) + (uVar10 & 0x5555) * 2;
          lVar5 = 0;
          do {
            lVar13 = lVar5;
            lVar5 = lVar13 + 1;
          } while ((a->z_length).maxcode[lVar13 + 10] <= (int)uVar10);
          if (lVar5 == 7) goto LAB_00116ee7;
          lVar17 = (ulong)(a->z_length).firstsymbol[lVar13 + 10] +
                   ((ulong)(uVar10 >> (7U - (char)lVar5 & 0x1f)) -
                   (ulong)(a->z_length).firstcode[lVar13 + 10]);
          if ((ulong)*(byte *)((long)a + lVar17 + 0x4b8) - 9 != lVar5) goto LAB_00116f10;
          uVar2 = uVar2 >> ((char)lVar13 + 10U & 0x1f);
          a->code_buffer = uVar2;
          iVar11 = (a->num_bits - (int)lVar5) + -9;
          a->num_bits = iVar11;
          uVar10 = (uint)*(ushort *)((long)a + lVar17 * 2 + 0x5d8);
        }
        else {
          uVar2 = uVar2 >> ((byte)(uVar7 >> 9) & 0x1f);
          a->code_buffer = uVar2;
          iVar11 = a->num_bits - (uint)(uVar7 >> 9);
          a->num_bits = iVar11;
          uVar10 = uVar7 & 0x1ff;
        }
        if (0xff < uVar10) break;
        if (a->zout_end <= pcVar21) {
          iVar11 = stbi__zexpand(a,pcVar21,1);
          if (iVar11 == 0) {
            return 0;
          }
          pcVar21 = a->zout;
        }
        *pcVar21 = (char)uVar10;
        pcVar21 = pcVar21 + 1;
      }
      if (uVar10 == 0x100) break;
      uVar23 = (ulong)(uVar10 - 0x101);
      uVar10 = stbi__zlength_base[uVar23];
      if (0xffffffffffffffeb < uVar23 - 0x1c) {
        iVar3 = stbi__zlength_extra[uVar23];
        if (iVar11 < iVar3) {
          stbi__fill_bits(a);
          iVar11 = a->num_bits;
          uVar2 = a->code_buffer;
        }
        uVar20 = ~(-1 << ((byte)iVar3 & 0x1f)) & uVar2;
        uVar2 = uVar2 >> ((byte)iVar3 & 0x1f);
        a->code_buffer = uVar2;
        iVar11 = iVar11 - iVar3;
        a->num_bits = iVar11;
        uVar10 = uVar10 + uVar20;
      }
      if (iVar11 < 0x10) {
        stbi__fill_bits(a);
        uVar2 = a->code_buffer;
      }
      uVar7 = z->fast[uVar2 & 0x1ff];
      if (uVar7 == 0) {
        uVar7 = (ushort)uVar2 << 8 | (ushort)uVar2 >> 8;
        uVar20 = (uVar7 & 0xf0f) << 4 | (uVar7 & 0xf0f0) >> 4;
        uVar20 = (uVar20 >> 2 & 0x3333) + (uVar20 & 0x3333) * 4;
        uVar20 = (uVar20 >> 1 & 0x5555) + (uVar20 & 0x5555) * 2;
        lVar5 = 0;
        do {
          lVar13 = lVar5;
          lVar5 = lVar13 + 1;
        } while ((a->z_distance).maxcode[lVar13 + 10] <= (int)uVar20);
        if (lVar5 == 7) goto LAB_00116ee7;
        lVar17 = (ulong)(a->z_distance).firstsymbol[lVar13 + 10] +
                 ((ulong)(uVar20 >> (7U - (char)lVar5 & 0x1f)) -
                 (ulong)(a->z_distance).firstcode[lVar13 + 10]);
        if ((ulong)*(byte *)((long)a + lVar17 + 0xc9c) - 9 != lVar5) {
LAB_00116f10:
          __assert_fail("z->size[b] == s",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/aaamp[P]entropy-experiment/thirdparty/SFML/extlibs/headers/stb_image/stb_image.h"
                        ,0xf24,"int stbi__zhuffman_decode_slowpath(stbi__zbuf *, stbi__zhuffman *)")
          ;
        }
        uVar2 = uVar2 >> ((char)lVar13 + 10U & 0x1f);
        a->code_buffer = uVar2;
        iVar11 = (a->num_bits - (int)lVar5) + -9;
        a->num_bits = iVar11;
        uVar20 = (uint)*(ushort *)((long)a + lVar17 * 2 + 0xdbc);
      }
      else {
        uVar2 = uVar2 >> ((byte)(uVar7 >> 9) & 0x1f);
        a->code_buffer = uVar2;
        iVar11 = a->num_bits - (uint)(uVar7 >> 9);
        a->num_bits = iVar11;
        uVar20 = uVar7 & 0x1ff;
      }
      uVar23 = (ulong)uVar20;
      iVar3 = stbi__zdist_base[uVar23];
      if (0xffffffffffffffe5 < uVar23 - 0x1e) {
        iVar4 = stbi__zdist_extra[uVar23];
        if (iVar11 < iVar4) {
          stbi__fill_bits(a);
          iVar11 = a->num_bits;
          uVar2 = a->code_buffer;
        }
        a->code_buffer = uVar2 >> ((byte)iVar4 & 0x1f);
        a->num_bits = iVar11 - iVar4;
        iVar3 = iVar3 + (~(-1 << ((byte)iVar4 & 0x1f)) & uVar2);
      }
      if ((long)pcVar21 - (long)a->zout_start < (long)iVar3) goto LAB_00116ee7;
      if (a->zout_end < pcVar21 + (int)uVar10) {
        iVar11 = stbi__zexpand(a,pcVar21,uVar10);
        if (iVar11 == 0) {
          return 0;
        }
        pcVar21 = a->zout;
      }
      lVar5 = -(long)iVar3;
      if (iVar3 == 1) {
        if (uVar10 != 0) {
          memset(pcVar21,(uint)(byte)pcVar21[lVar5],(ulong)uVar10);
          pcVar21 = pcVar21 + (ulong)(uVar10 - 1) + 1;
        }
      }
      else {
        for (; uVar10 != 0; uVar10 = uVar10 - 1) {
          *pcVar21 = pcVar21[lVar5];
          pcVar21 = pcVar21 + 1;
        }
      }
    }
    a->zout = pcVar21;
LAB_00116ed8:
    if ((uVar8 & 1) != 0) {
      return 1;
    }
    iVar11 = a->num_bits;
  } while( true );
}

Assistant:

static int stbi__do_zlib(stbi__zbuf *a, char *obuf, int olen, int exp, int parse_header)
{
   a->zout_start = obuf;
   a->zout       = obuf;
   a->zout_end   = obuf + olen;
   a->z_expandable = exp;

   return stbi__parse_zlib(a, parse_header);
}